

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O3

void __thiscall LinearScan::CheckOpHelper(LinearScan *this,Instr *instr)

{
  RealCount *pRVar1;
  Iterator *this_00;
  char cVar2;
  RegNum RVar3;
  OpCode OVar4;
  uint uVar5;
  Lifetime *lifetime;
  OpHelperBlock *pOVar6;
  code *pcVar7;
  bool bVar8;
  ushort uVar9;
  uint32 uVar10;
  uint uVar11;
  undefined4 *puVar12;
  Type *ppLVar13;
  Type pSVar14;
  PragmaInstr *instr_00;
  Type *pTVar15;
  NodeBase *pNVar16;
  char *message;
  SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *pSVar17;
  char *error;
  char *fileName;
  byte bVar18;
  SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *this_01;
  uint32 helperSpilledLiveranges;
  Instr *local_40;
  undefined1 local_34;
  
  if ((this->currentOpHelperBlock != (OpHelperBlock *)0x0) &&
     (this->currentOpHelperBlock->opHelperEndInstr == instr)) {
    if (instr->m_kind == InstrKindBranch) {
      OVar4 = instr->m_opcode;
      if (OVar4 < ADD) {
        if ((OVar4 != Br) && (OVar4 != MultiBr)) goto LAB_0057ebc3;
      }
      else {
        bVar8 = LowererMD::IsUnconditionalBranch(instr);
        if (!bVar8) goto LAB_0057ebc3;
        if (instr->m_kind != InstrKindBranch) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar12 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
          if (!bVar8) goto LAB_0057f0b7;
          *puVar12 = 0;
        }
      }
      cVar2 = *(char *)((long)&instr[1]._vptr_Instr + 1);
      if (instr[1].m_next == (Instr *)0x0) {
        if (cVar2 == '\0') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar12 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x20e,"(m_isMultiBranch)","m_isMultiBranch");
          if (!bVar8) goto LAB_0057f0b7;
          *puVar12 = 0;
        }
        else {
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        }
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        fileName = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
        ;
        error = "(!instr->AsBranchInstr()->IsMultiBranch())";
        message = "Not supported for Multibranch";
        uVar11 = 0x23f;
LAB_0057ec6f:
        bVar8 = Js::Throw::ReportAssert(fileName,uVar11,error,message);
        if (!bVar8) goto LAB_0057f0b7;
        *puVar12 = 0;
      }
      else if (cVar2 != '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        fileName = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
        ;
        error = "(!m_isMultiBranch)";
        message = "!m_isMultiBranch";
        uVar11 = 0x209;
        goto LAB_0057ec6f;
      }
      if (instr->m_kind != InstrKindBranch) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
        if (!bVar8) goto LAB_0057f0b7;
        *puVar12 = 0;
      }
      local_40 = instr[1].m_next;
    }
    else {
LAB_0057ebc3:
      local_40 = (Instr *)0x0;
    }
    helperSpilledLiveranges = 0;
    this_01 = this->opHelperSpilledLiveranges;
    if ((SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)
        (this_01->super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>).
        super_SListNodeBase<Memory::ArenaAllocator>.next != this_01) {
      helperSpilledLiveranges = 0;
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      do {
        ppLVar13 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Head
                             (&this_01->
                               super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>);
        lifetime = *ppLVar13;
        SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::RemoveHead
                  (&this_01->super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>,
                   this_01->allocator);
        uVar9 = *(ushort *)&lifetime->field_0x9c;
        *(ushort *)&lifetime->field_0x9c = uVar9 & 0xffef;
        if ((uVar9 & 0x40) == 0) {
          AssignActiveReg(this,lifetime,lifetime->reg);
          if (local_40 == (Instr *)0x0) {
            bVar18 = (byte)*(undefined2 *)&lifetime->field_0x9c;
LAB_0057ee52:
            local_34 = 1;
LAB_0057ee57:
            helperSpilledLiveranges = helperSpilledLiveranges + 1;
            RVar3 = lifetime->reg;
            pOVar6 = this->currentOpHelperBlock;
            pSVar14 = (Type)new<Memory::ArenaAllocator>
                                      (0x18,(pOVar6->spilledLifetime).allocator,0x364470);
            pSVar14[1].next = (Type)lifetime;
            *(RegNum *)&pSVar14[2].next = RVar3;
            *(byte *)((long)&pSVar14[2].next + 1) = bVar18 >> 5 & 1;
            *(undefined1 *)((long)&pSVar14[2].next + 2) = local_34;
            pSVar14->next =
                 (pOVar6->spilledLifetime).
                 super_SListBase<OpHelperSpilledLifetime,_Memory::ArenaAllocator,_RealCount>.
                 super_SListNodeBase<Memory::ArenaAllocator>.next;
            (pOVar6->spilledLifetime).
            super_SListBase<OpHelperSpilledLifetime,_Memory::ArenaAllocator,_RealCount>.
            super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar14;
            pRVar1 = &(pOVar6->spilledLifetime).
                      super_SListBase<OpHelperSpilledLifetime,_Memory::ArenaAllocator,_RealCount>.
                      super_RealCount;
            pRVar1->count = pRVar1->count + 1;
            uVar9 = *(ushort *)&lifetime->field_0x9c;
            goto LAB_0057eebd;
          }
          uVar5 = lifetime->end;
          uVar10 = IR::Instr::GetNumber(local_40);
          bVar18 = (byte)*(ushort *)&lifetime->field_0x9c;
          if (uVar10 <= uVar5) goto LAB_0057ee52;
          if ((*(ushort *)&lifetime->field_0x9c & 0x20) != 0) {
            local_34 = 0;
            goto LAB_0057ee57;
          }
          if (instr->m_kind != InstrKindBranch) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar12 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                               ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
            if (!bVar8) goto LAB_0057f0b7;
            *puVar12 = 0;
          }
          bVar8 = IR::BranchInstr::IsLoopTail((BranchInstr *)instr,this->func);
          if (bVar8) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar12 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                               ,0x265,"(!instr->AsBranchInstr()->IsLoopTail(this->func))",
                               "!instr->AsBranchInstr()->IsLoopTail(this->func)");
            if (!bVar8) goto LAB_0057f0b7;
            *puVar12 = 0;
          }
        }
        else {
          uVar9 = uVar9 & 0xffaf;
LAB_0057eebd:
          *(ushort *)&lifetime->field_0x9c = uVar9 & 0xffdf;
        }
        this_01 = this->opHelperSpilledLiveranges;
      } while ((SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)
               (this_01->super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>).
               super_SListNodeBase<Memory::ArenaAllocator>.next != this_01);
    }
    uVar11 = OpHelperBlock::Length(this->currentOpHelperBlock);
    this->totalOpHelperFullVisitedLength = this->totalOpHelperFullVisitedLength + uVar11;
    instr_00 = IR::PragmaInstr::New(Nop,0,this->func);
    IR::Instr::InsertBefore(this->currentOpHelperBlock->opHelperEndInstr,&instr_00->super_Instr);
    uVar10 = IR::Instr::GetNumber(this->currentOpHelperBlock->opHelperEndInstr);
    IR::Instr::SetNumber(&instr_00->super_Instr,uVar10);
    this->currentOpHelperBlock->opHelperEndInstr = &instr_00->super_Instr;
    (this->opHelperSpilledRegs).word = 0;
    this->currentOpHelperBlock = (OpHelperBlock *)0x0;
    LinearScanMD::EndOfHelperBlock(&this->linearScanMD,helperSpilledLiveranges);
  }
  pSVar17 = (SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *)
            (this->opHelperBlockIter).current;
  if ((pSVar17 != (SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *)0x0) &&
     (pSVar17 != (this->opHelperBlockIter).list)) {
    this_00 = &this->opHelperBlockIter;
    if (((instr->m_kind == InstrKindProfiledLabel) || (instr->m_kind == InstrKindLabel)) &&
       ((((ulong)instr[1].m_func & 2) != 0 &&
        (pTVar15 = SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                             (this_00), pTVar15->opHelperLabel != (LabelInstr *)instr)))) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0x29a,
                         "(!instr->IsLabelInstr() || !instr->AsLabelInstr()->isOpHelper || this->opHelperBlockIter.Data().opHelperLabel == instr)"
                         ,
                         "Found a helper label that doesn\'t begin the next helper block in the list?"
                        );
      if (!bVar8) goto LAB_0057f0b7;
      *puVar12 = 0;
    }
    pTVar15 = SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(this_00);
    if (pTVar15->opHelperLabel == (LabelInstr *)instr) {
      pTVar15 = SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(this_00)
      ;
      this->currentOpHelperBlock = pTVar15;
      pNVar16 = (this->opHelperBlockIter).current;
      if (pNVar16 == (NodeBase *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar8) {
LAB_0057f0b7:
          pcVar7 = (code *)invalidInstructionException();
          (*pcVar7)();
        }
        *puVar12 = 0;
        pNVar16 = (this->opHelperBlockIter).current;
      }
      pSVar17 = (SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *)0x0;
      if ((SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *)pNVar16->next !=
          (this->opHelperBlockIter).list) {
        pSVar17 = (SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *)pNVar16->next;
      }
      (this->opHelperBlockIter).current = &pSVar17->super_SListNodeBase<Memory::ArenaAllocator>;
    }
  }
  return;
}

Assistant:

void
LinearScan::CheckOpHelper(IR::Instr *instr)
{
    if (this->IsInHelperBlock())
    {
        if (this->currentOpHelperBlock->opHelperEndInstr == instr)
        {
            // Get targetInstr if we can.
            // We can deterministically get it only for unconditional branches, as conditional branch may fall through.
            IR::Instr * targetInstr = nullptr;
            if (instr->IsBranchInstr() && instr->AsBranchInstr()->IsUnconditional())
            {
                AssertMsg(!instr->AsBranchInstr()->IsMultiBranch(), "Not supported for Multibranch");
                targetInstr = instr->AsBranchInstr()->GetTarget();
            }

            /*
             * Keep track of the number of registers we've had to
             * store and restore around a helper block for LinearScanMD (on ARM
             * and X64). We need this to be able to allocate space in the frame.
             * We can't emit a PUSH/POP sequence around the block like IA32 because
             * the stack pointer can't move outside the prolog.
             */
            uint32 helperSpilledLiverangeCount = 0;

            // Exiting a helper block.  We are going to insert
            // the restore here after linear scan.  So put all the restored
            // lifetime back to active
            while (!this->opHelperSpilledLiveranges->Empty())
            {
                Lifetime * lifetime = this->opHelperSpilledLiveranges->Pop();
                lifetime->isOpHelperSpilled = false;

                if (!lifetime->cantOpHelperSpill)
                {
                    // Put the life time back to active
                    this->AssignActiveReg(lifetime, lifetime->reg);
                    bool reload = true;
                    // Lifetime ends before the target after helper block, don't need to save and restore helper spilled lifetime.
                    if (targetInstr && lifetime->end < targetInstr->GetNumber())
                    {
                        // However, if lifetime is spilled as arg - we still need to spill it because the helper assumes the value
                        // to be available in the stack
                        if (lifetime->isOpHelperSpillAsArg)
                        {
                            // we should not attempt to restore it as it is dead on return from the helper.
                            reload = false;
                        }
                        else
                        {
                            Assert(!instr->AsBranchInstr()->IsLoopTail(this->func));
                            continue;
                        }
                    }

                    // Save all the lifetime that needs to be restored
                    OpHelperSpilledLifetime spilledLifetime;
                    spilledLifetime.lifetime = lifetime;
                    spilledLifetime.spillAsArg = lifetime->isOpHelperSpillAsArg;
                    spilledLifetime.reload = reload;
                    /*
                     * Can't unfortunately move this into the else block above because we don't know if this
                     * lifetime will actually get spilled until register allocation completes.
                     * Instead we allocate a slot to this StackSym in LinearScanMD iff
                     * !(lifetime.isSpilled && lifetime.noReloadsIfSpilled).
                     */
                    helperSpilledLiverangeCount++;

                    // save the reg in case it is spilled later.  We still need to save and restore
                    // for the non-loop case.
                    spilledLifetime.reg = lifetime->reg;
                    this->currentOpHelperBlock->spilledLifetime.Prepend(spilledLifetime);
                }
                else
                {
                    // Clear it for the next helper block
                    lifetime->cantOpHelperSpill = false;
                }
                lifetime->isOpHelperSpillAsArg = false;
            }

            this->totalOpHelperFullVisitedLength += this->currentOpHelperBlock->Length();

            // Use a dummy label as the insertion point of the reloads, as second-chance-allocation
            // may insert compensation code right before the branch
            IR::PragmaInstr *dummyLabel = IR::PragmaInstr::New(Js::OpCode::Nop, 0, this->func);
            this->currentOpHelperBlock->opHelperEndInstr->InsertBefore(dummyLabel);
            dummyLabel->CopyNumber(this->currentOpHelperBlock->opHelperEndInstr);
            this->currentOpHelperBlock->opHelperEndInstr = dummyLabel;

            this->opHelperSpilledRegs.ClearAll();
            this->currentOpHelperBlock = nullptr;

            linearScanMD.EndOfHelperBlock(helperSpilledLiverangeCount);
        }
    }

    if (this->opHelperBlockIter.IsValid())
    {
        AssertMsg(
            !instr->IsLabelInstr() ||
            !instr->AsLabelInstr()->isOpHelper ||
            this->opHelperBlockIter.Data().opHelperLabel == instr,
            "Found a helper label that doesn't begin the next helper block in the list?");

        if (this->opHelperBlockIter.Data().opHelperLabel == instr)
        {
            this->currentOpHelperBlock = &this->opHelperBlockIter.Data();
            this->opHelperBlockIter.Next();
        }
    }
}